

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Person.cpp
# Opt level: O1

string * __thiscall mbc::Val::Person::hash__abi_cxx11_(string *__return_storage_ptr__,Person *this)

{
  Ch *pCVar1;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_b8;
  string local_80;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_60;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  local_60.os_ = &local_b8;
  local_b8.stack_.stackEnd_ = (char *)0x0;
  local_b8.stack_.stack_ = (char *)0x0;
  local_b8.stack_.stackTop_ = (char *)0x0;
  local_b8.stack_.allocator_ = (CrtAllocator *)0x0;
  local_b8.stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_b8.stack_.initialCapacity_ = 0x100;
  local_60.level_stack_.allocator_ = (CrtAllocator *)0x0;
  local_60.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_60.level_stack_.stack_ = (char *)0x0;
  local_60.level_stack_.stackTop_ = (char *)0x0;
  local_60.level_stack_.stackEnd_ = (char *)0x0;
  local_60.level_stack_.initialCapacity_ = 0x200;
  local_60.maxDecimalPlaces_ = 0x144;
  local_60.hasRoot_ = false;
  json_value((Person *)&stack0xffffffffffffffe0);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
            (local_20,&local_60);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  pCVar1 = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                     (&local_b8);
  std::__cxx11::string::string((string *)&local_80,pCVar1,(allocator *)&stack0xffffffffffffffe0);
  units::md5(__return_storage_ptr__,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  free(local_60.level_stack_.stack_);
  if (local_60.level_stack_.ownAllocator_ != (CrtAllocator *)0x0) {
    operator_delete(local_60.level_stack_.ownAllocator_);
  }
  free(local_b8.stack_.stack_);
  if (local_b8.stack_.ownAllocator_ != (CrtAllocator *)0x0) {
    operator_delete(local_b8.stack_.ownAllocator_);
  }
  return __return_storage_ptr__;
}

Assistant:

string Person::hash_() {
    rapidjson::StringBuffer buffer;
    rapidjson::Writer<rapidjson::StringBuffer> writer(buffer);
    // why I should add a prefix?
    Person::json_value() -> Accept(writer);
    return units::md5(buffer.GetString());
}